

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::changeEvent(QComboBox *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  Type TVar3;
  QComboBoxPrivate *this_00;
  QPlatformTheme *pQVar4;
  long lVar5;
  QFont *pQVar6;
  QComboBoxPrivateContainer *this_01;
  QAbstractItemView *pQVar7;
  QEvent *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar8;
  QComboBoxPrivate *in_stack_00000008;
  QFont *platformFont;
  Font f;
  QComboBoxPrivate *d;
  QFont f_1;
  QSize *in_stack_ffffffffffffff90;
  WidgetAttribute attribute;
  undefined4 in_stack_ffffffffffffffa0;
  QComboBoxPrivateContainer *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  SubElement in_stack_ffffffffffffffb4;
  undefined4 uVar9;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QComboBox *)0x53c01f);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == PaletteChange) {
    QComboBoxPrivate::updateViewContainerPaletteAndOpacity
              ((QComboBoxPrivate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else if (TVar2 == FontChange) {
    QSize::QSize(in_stack_ffffffffffffff90);
    this_00->sizeHint = local_30;
    QComboBoxPrivate::viewContainer(in_stack_00000008);
    QWidget::font((QWidget *)in_RDI);
    QWidget::setFont((QWidget *)this_00,
                     (QFont *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    this_01 = QComboBoxPrivate::viewContainer(in_stack_00000008);
    pQVar7 = QComboBoxPrivateContainer::itemView(this_01);
    (**(code **)(*(long *)&(pQVar7->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x220))
              ();
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
  }
  else if (TVar2 == EnabledChange) {
    bVar1 = QWidget::isEnabled((QWidget *)0x53c1fb);
    if (!bVar1) {
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1b0))();
    }
  }
  else if (TVar2 == StyleChange) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x53c07d);
    if (bVar1) {
      QPointer<QComboBoxPrivateContainer>::operator->
                ((QPointer<QComboBoxPrivateContainer> *)0x53c094);
      QComboBoxPrivateContainer::updateStyleSettings(in_stack_ffffffffffffffa8);
    }
    QComboBoxPrivate::updateDelegate(this_00,SUB41(in_stack_ffffffffffffffb4 >> 0x18,0));
    QSize::QSize(in_stack_ffffffffffffff90);
    this_00->sizeHint = local_20;
    QSize::QSize(in_stack_ffffffffffffff90);
    attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    this_00->minimumSizeHint = local_28;
    QComboBoxPrivate::updateLayoutDirection(in_RDI);
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
    QWidgetPrivate::setLayoutItemMargins
              (&this_00->super_QWidgetPrivate,in_stack_ffffffffffffffb4,
               (QStyleOption *)in_stack_ffffffffffffffa8);
    TVar3 = QEvent::type(in_RSI);
    if (TVar3 == MacSizeChange) {
      uVar9 = 0;
      bVar1 = QWidget::testAttribute((QWidget *)in_RDI,attribute);
      if (bVar1) {
        uVar9 = 0x15;
      }
      else {
        bVar1 = QWidget::testAttribute((QWidget *)in_RDI,attribute);
        if (bVar1) {
          uVar9 = 0x16;
        }
      }
      pQVar4 = QGuiApplicationPrivate::platformTheme();
      lVar5 = (**(code **)(*(long *)pQVar4 + 0x58))(pQVar4,uVar9);
      if (lVar5 != 0) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar6 = QWidget::font((QWidget *)in_RDI);
        QFont::QFont((QFont *)&local_18,pQVar6);
        dVar8 = (double)QFont::pointSizeF();
        QFont::setPointSizeF(dVar8);
        QWidget::setFont((QWidget *)this_00,(QFont *)CONCAT44(uVar9,in_stack_ffffffffffffffb0));
        QFont::~QFont((QFont *)&local_18);
      }
    }
  }
  QWidget::changeEvent((QWidget *)CONCAT44(TVar2,in_stack_ffffffffffffffa0),(QEvent *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::changeEvent(QEvent *e)
{
    Q_D(QComboBox);
    switch (e->type()) {
    case QEvent::StyleChange:
        if (d->container)
            d->container->updateStyleSettings();
        d->updateDelegate();

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->sizeHint = QSize(); // invalidate size hint
        d->minimumSizeHint = QSize();
        d->updateLayoutDirection();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        d->setLayoutItemMargins(QStyle::SE_ComboBoxLayoutItem);

        if (e->type() == QEvent::MacSizeChange) {
            QPlatformTheme::Font f = QPlatformTheme::SystemFont;
            if (testAttribute(Qt::WA_MacSmallSize))
                f = QPlatformTheme::SmallFont;
            else if (testAttribute(Qt::WA_MacMiniSize))
                f = QPlatformTheme::MiniFont;
            if (const QFont *platformFont = QApplicationPrivate::platformTheme()->font(f)) {
                QFont f = font();
                f.setPointSizeF(platformFont->pointSizeF());
                setFont(f);
            }
        }
        // ### need to update scrollers etc. as well here
        break;
    case QEvent::EnabledChange:
        if (!isEnabled())
            hidePopup();
        break;
    case QEvent::PaletteChange: {
        d->updateViewContainerPaletteAndOpacity();
        break;
    }
    case QEvent::FontChange: {
        d->sizeHint = QSize(); // invalidate size hint
        d->viewContainer()->setFont(font());
        d->viewContainer()->itemView()->doItemsLayout();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        break;
    }
    default:
        break;
    }
    QWidget::changeEvent(e);
}